

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockCallTest_expectNCalls_NotFulfilled_TestShell::createTest
          (TEST_MockCallTest_expectNCalls_NotFulfilled_TestShell *this)

{
  Utest *this_00;
  TEST_MockCallTest_expectNCalls_NotFulfilled_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0x1bc);
  TEST_MockCallTest_expectNCalls_NotFulfilled_Test::TEST_MockCallTest_expectNCalls_NotFulfilled_Test
            ((TEST_MockCallTest_expectNCalls_NotFulfilled_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, expectNCalls_NotFulfilled)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(2, "boo")->callWasMade(1);
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectNCalls(2, "boo");
    mock().actualCall("boo");
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}